

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *__pattern;
  char *in_R9;
  string local_70;
  RE local_50 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  
  pcVar3 = strdup(regex);
  *(char **)this = pcVar3;
  sVar4 = strlen(regex);
  pcVar3 = (char *)operator_new__(sVar4 + 10);
  snprintf(pcVar3,sVar4 + 10,"^(%s)$",regex);
  iVar2 = regcomp((regex_t *)(this + 0x10),pcVar3,1);
  local_50[0] = (RE)(iVar2 == 0);
  this[8] = local_50[0];
  if ((bool)local_50[0]) {
    __pattern = "()";
    if (*regex != '\0') {
      __pattern = regex;
    }
    iVar2 = regcomp((regex_t *)(this + 0x50),__pattern,1);
    local_50[0] = (RE)(iVar2 == 0);
    this[8] = local_50[0];
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if ((bool)local_50[0]) goto LAB_00131fd1;
  }
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  Message::Message((Message *)&gtest_ar_.message_);
  paVar1 = &(gtest_ar_.message_.ptr_)->field_2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)paVar1->_M_local_buf,"Regular expression \"",0x14);
  if (regex == (char *)0x0) {
    sVar4 = 6;
    regex = "(null)";
  }
  else {
    sVar4 = strlen(regex);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)paVar1->_M_local_buf,regex,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)paVar1->_M_local_buf,"\" is not a valid POSIX Extended regular expression.",
             0x33);
  GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_70,(internal *)local_50,(AssertionResult *)"is_valid_","false","true",in_R9);
  AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/lib/googletest/src/gtest-port.cc"
             ,0x268,local_70._M_dataplus._M_p);
  AssertHelper::operator=(&local_38,(Message *)&gtest_ar_.message_);
  AssertHelper::~AssertHelper(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (gtest_ar_.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p + 8))(gtest_ar_.message_.ptr_);
  }
LAB_00131fd1:
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete__(pcVar3);
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}